

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteReporter.cpp
# Opt level: O0

void __thiscall jaegertracing::reporters::RemoteReporter::flush(RemoteReporter *this)

{
  int iVar1;
  pointer pSVar2;
  Counter *pCVar3;
  rep rVar4;
  Exception *ex;
  int flushed;
  RemoteReporter *this_local;
  
  pSVar2 = std::unique_ptr<jaegertracing::Sender,_std::default_delete<jaegertracing::Sender>_>::
           operator->(&this->_sender);
  iVar1 = (*pSVar2->_vptr_Sender[3])();
  if (0 < iVar1) {
    pCVar3 = metrics::Metrics::reporterSuccess(this->_metrics);
    (*pCVar3->_vptr_Counter[2])(pCVar3,(long)iVar1);
  }
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->_lastFlush).__d.__r = rVar4;
  return;
}

Assistant:

void RemoteReporter::flush() noexcept
{
    try {
        const auto flushed = _sender->flush();
        if (flushed > 0) {
            _metrics.reporterSuccess().inc(flushed);
        }
    } catch (const Sender::Exception& ex) {
        _metrics.reporterFailure().inc(ex.numFailed());
        _logger.error(ex.what());
    }

    _lastFlush = Clock::now();
}